

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

UInt32 testing::internal::CreateCodePointFromUtf16SurrogatePair(wchar_t first,wchar_t second)

{
  UInt32 mask;
  UInt32 second_u;
  UInt32 first_u;
  wchar_t second_local;
  wchar_t first_local;
  
  return first;
}

Assistant:

inline UInt32 CreateCodePointFromUtf16SurrogatePair(wchar_t first,
                                                    wchar_t second) {
  const auto first_u = static_cast<UInt32>(first);
  const auto second_u = static_cast<UInt32>(second);
  const UInt32 mask = (1 << 10) - 1;
  return (sizeof(wchar_t) == 2)
             ? (((first_u & mask) << 10) | (second_u & mask)) + 0x10000
             :
             // This function should not be called when the condition is
             // false, but we provide a sensible default in case it is.
             first_u;
}